

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

mu * __thiscall llvm::APInt::magicu(mu *__return_storage_ptr__,APInt *this,uint LeadingZeros)

{
  bool bVar1;
  uint uVar2;
  bool local_3a2;
  bool local_3a1;
  bool local_39b;
  APInt local_388;
  APInt local_378;
  APInt local_368;
  APInt local_358;
  APInt local_348;
  APInt local_338;
  APInt local_328;
  APInt local_318;
  APInt local_308;
  APInt local_2f8;
  APInt local_2e8;
  APInt local_2d8;
  APInt local_2c8;
  APInt local_2b8;
  APInt local_2a8;
  APInt local_298;
  APInt local_288;
  APInt local_278;
  APInt local_268;
  APInt local_258;
  APInt local_248;
  APInt local_238;
  APInt local_228;
  APInt local_218;
  APInt local_208;
  APInt local_1f8;
  APInt local_1e8;
  APInt local_1d8;
  APInt local_1c8;
  APInt local_1b8;
  APInt local_1a8;
  APInt local_198;
  APInt local_188;
  APInt local_178;
  APInt local_168;
  APInt local_158;
  APInt local_148;
  APInt local_138;
  APInt local_128;
  APInt local_118;
  APInt local_108;
  APInt local_f8;
  APInt local_e8;
  undefined1 local_d8 [8];
  APInt signedMax;
  APInt signedMin;
  undefined1 local_a8 [8];
  APInt allOnes;
  undefined1 local_90 [8];
  APInt r2;
  APInt q2;
  APInt r1;
  APInt q1;
  APInt delta;
  APInt nc;
  uint p;
  APInt *d;
  uint LeadingZeros_local;
  APInt *this_local;
  mu *magu;
  
  APInt((APInt *)&delta.BitWidth);
  APInt((APInt *)&q1.BitWidth);
  APInt((APInt *)&r1.BitWidth);
  APInt((APInt *)&q2.BitWidth);
  APInt((APInt *)&r2.BitWidth);
  APInt((APInt *)local_90);
  allOnes._15_1_ = 0;
  mu::mu(__return_storage_ptr__);
  __return_storage_ptr__->a = false;
  uVar2 = getBitWidth(this);
  getAllOnesValue((APInt *)&signedMin.BitWidth,uVar2);
  lshr((APInt *)local_a8,(int)&signedMin + 8);
  ~APInt((APInt *)&signedMin.BitWidth);
  uVar2 = getBitWidth(this);
  getSignedMinValue((APInt *)&signedMax.BitWidth,uVar2);
  uVar2 = getBitWidth(this);
  getSignedMaxValue((APInt *)local_d8,uVar2);
  APInt(&local_118,(APInt *)local_a8);
  llvm::operator-((llvm *)&local_108,&local_118,this);
  urem(&local_f8,&local_108);
  llvm::operator-((llvm *)&local_e8,(APInt *)local_a8,&local_f8);
  operator=((APInt *)&delta.BitWidth,&local_e8);
  ~APInt(&local_e8);
  ~APInt(&local_f8);
  ~APInt(&local_108);
  ~APInt(&local_118);
  uVar2 = getBitWidth(this);
  nc._12_4_ = uVar2 - 1;
  udiv(&local_128,(APInt *)&signedMax.BitWidth);
  operator=((APInt *)&r1.BitWidth,&local_128);
  ~APInt(&local_128);
  operator*(&local_148,(APInt *)&r1.BitWidth);
  llvm::operator-((llvm *)&local_138,(APInt *)&signedMax.BitWidth,&local_148);
  operator=((APInt *)&q2.BitWidth,&local_138);
  ~APInt(&local_138);
  ~APInt(&local_148);
  udiv(&local_158,(APInt *)local_d8);
  operator=((APInt *)&r2.BitWidth,&local_158);
  ~APInt(&local_158);
  operator*(&local_178,(APInt *)&r2.BitWidth);
  llvm::operator-((llvm *)&local_168,(APInt *)local_d8,&local_178);
  operator=((APInt *)local_90,&local_168);
  ~APInt(&local_168);
  ~APInt(&local_178);
  do {
    nc._12_4_ = nc._12_4_ + 1;
    APInt(&local_198,(APInt *)&delta.BitWidth);
    llvm::operator-((llvm *)&local_188,&local_198,(APInt *)&q2.BitWidth);
    bVar1 = uge((APInt *)&q2.BitWidth,&local_188);
    ~APInt(&local_188);
    ~APInt(&local_198);
    if (bVar1) {
      APInt(&local_1c8,(APInt *)&r1.BitWidth);
      llvm::operator+((llvm *)&local_1b8,&local_1c8,(APInt *)&r1.BitWidth);
      llvm::operator+((llvm *)&local_1a8,&local_1b8,1);
      operator=((APInt *)&r1.BitWidth,&local_1a8);
      ~APInt(&local_1a8);
      ~APInt(&local_1b8);
      ~APInt(&local_1c8);
      APInt(&local_1f8,(APInt *)&q2.BitWidth);
      llvm::operator+((llvm *)&local_1e8,&local_1f8,(APInt *)&q2.BitWidth);
      llvm::operator-((llvm *)&local_1d8,&local_1e8,(APInt *)&delta.BitWidth);
      operator=((APInt *)&q2.BitWidth,&local_1d8);
      ~APInt(&local_1d8);
      ~APInt(&local_1e8);
      ~APInt(&local_1f8);
    }
    else {
      APInt(&local_218,(APInt *)&r1.BitWidth);
      llvm::operator+((llvm *)&local_208,&local_218,(APInt *)&r1.BitWidth);
      operator=((APInt *)&r1.BitWidth,&local_208);
      ~APInt(&local_208);
      ~APInt(&local_218);
      APInt(&local_238,(APInt *)&q2.BitWidth);
      llvm::operator+((llvm *)&local_228,&local_238,(APInt *)&q2.BitWidth);
      operator=((APInt *)&q2.BitWidth,&local_228);
      ~APInt(&local_228);
      ~APInt(&local_238);
    }
    APInt(&local_258,(APInt *)local_90);
    llvm::operator+((llvm *)&local_248,&local_258,1);
    APInt(&local_278,this);
    llvm::operator-((llvm *)&local_268,&local_278,(APInt *)local_90);
    bVar1 = uge(&local_248,&local_268);
    ~APInt(&local_268);
    ~APInt(&local_278);
    ~APInt(&local_248);
    ~APInt(&local_258);
    if (bVar1) {
      bVar1 = uge((APInt *)&r2.BitWidth,(APInt *)local_d8);
      if (bVar1) {
        __return_storage_ptr__->a = true;
      }
      APInt(&local_2a8,(APInt *)&r2.BitWidth);
      llvm::operator+((llvm *)&local_298,&local_2a8,(APInt *)&r2.BitWidth);
      llvm::operator+((llvm *)&local_288,&local_298,1);
      operator=((APInt *)&r2.BitWidth,&local_288);
      ~APInt(&local_288);
      ~APInt(&local_298);
      ~APInt(&local_2a8);
      APInt(&local_2e8,(APInt *)local_90);
      llvm::operator+((llvm *)&local_2d8,&local_2e8,(APInt *)local_90);
      llvm::operator+((llvm *)&local_2c8,&local_2d8,1);
      llvm::operator-((llvm *)&local_2b8,&local_2c8,this);
      operator=((APInt *)local_90,&local_2b8);
      ~APInt(&local_2b8);
      ~APInt(&local_2c8);
      ~APInt(&local_2d8);
      ~APInt(&local_2e8);
    }
    else {
      bVar1 = uge((APInt *)&r2.BitWidth,(APInt *)&signedMax.BitWidth);
      if (bVar1) {
        __return_storage_ptr__->a = true;
      }
      APInt(&local_308,(APInt *)&r2.BitWidth);
      llvm::operator+((llvm *)&local_2f8,&local_308,(APInt *)&r2.BitWidth);
      operator=((APInt *)&r2.BitWidth,&local_2f8);
      ~APInt(&local_2f8);
      ~APInt(&local_308);
      APInt(&local_338,(APInt *)local_90);
      llvm::operator+((llvm *)&local_328,&local_338,(APInt *)local_90);
      llvm::operator+((llvm *)&local_318,&local_328,1);
      operator=((APInt *)local_90,&local_318);
      ~APInt(&local_318);
      ~APInt(&local_328);
      ~APInt(&local_338);
    }
    APInt(&local_368,this);
    llvm::operator-((llvm *)&local_358,&local_368,1);
    llvm::operator-((llvm *)&local_348,&local_358,(APInt *)local_90);
    operator=((APInt *)&q1.BitWidth,&local_348);
    ~APInt(&local_348);
    ~APInt(&local_358);
    ~APInt(&local_368);
    uVar2 = getBitWidth(this);
    local_39b = false;
    if ((uint)nc._12_4_ < uVar2 << 1) {
      bVar1 = ult((APInt *)&r1.BitWidth,(APInt *)&q1.BitWidth);
      local_3a1 = true;
      if (!bVar1) {
        bVar1 = operator==((APInt *)&r1.BitWidth,(APInt *)&q1.BitWidth);
        local_3a2 = false;
        if (bVar1) {
          local_3a2 = operator==((APInt *)&q2.BitWidth,0);
        }
        local_3a1 = local_3a2;
      }
      local_39b = local_3a1;
    }
  } while (local_39b != false);
  APInt(&local_388,(APInt *)&r2.BitWidth);
  llvm::operator+((llvm *)&local_378,&local_388,1);
  operator=(&__return_storage_ptr__->m,&local_378);
  ~APInt(&local_378);
  ~APInt(&local_388);
  uVar2 = getBitWidth(this);
  __return_storage_ptr__->s = nc._12_4_ - uVar2;
  allOnes._15_1_ = 1;
  ~APInt((APInt *)local_d8);
  ~APInt((APInt *)&signedMax.BitWidth);
  ~APInt((APInt *)local_a8);
  if ((allOnes._15_1_ & 1) == 0) {
    mu::~mu(__return_storage_ptr__);
  }
  ~APInt((APInt *)local_90);
  ~APInt((APInt *)&r2.BitWidth);
  ~APInt((APInt *)&q2.BitWidth);
  ~APInt((APInt *)&r1.BitWidth);
  ~APInt((APInt *)&q1.BitWidth);
  ~APInt((APInt *)&delta.BitWidth);
  return __return_storage_ptr__;
}

Assistant:

APInt::mu APInt::magicu(unsigned LeadingZeros) const {
  const APInt& d = *this;
  unsigned p;
  APInt nc, delta, q1, r1, q2, r2;
  struct mu magu;
  magu.a = 0;               // initialize "add" indicator
  APInt allOnes = APInt::getAllOnesValue(d.getBitWidth()).lshr(LeadingZeros);
  APInt signedMin = APInt::getSignedMinValue(d.getBitWidth());
  APInt signedMax = APInt::getSignedMaxValue(d.getBitWidth());

  nc = allOnes - (allOnes - d).urem(d);
  p = d.getBitWidth() - 1;  // initialize p
  q1 = signedMin.udiv(nc);  // initialize q1 = 2p/nc
  r1 = signedMin - q1*nc;   // initialize r1 = rem(2p,nc)
  q2 = signedMax.udiv(d);   // initialize q2 = (2p-1)/d
  r2 = signedMax - q2*d;    // initialize r2 = rem((2p-1),d)
  do {
    p = p + 1;
    if (r1.uge(nc - r1)) {
      q1 = q1 + q1 + 1;  // update q1
      r1 = r1 + r1 - nc; // update r1
    }
    else {
      q1 = q1+q1; // update q1
      r1 = r1+r1; // update r1
    }
    if ((r2 + 1).uge(d - r2)) {
      if (q2.uge(signedMax)) magu.a = 1;
      q2 = q2+q2 + 1;     // update q2
      r2 = r2+r2 + 1 - d; // update r2
    }
    else {
      if (q2.uge(signedMin)) magu.a = 1;
      q2 = q2+q2;     // update q2
      r2 = r2+r2 + 1; // update r2
    }
    delta = d - 1 - r2;
  } while (p < d.getBitWidth()*2 &&
           (q1.ult(delta) || (q1 == delta && r1 == 0)));
  magu.m = q2 + 1; // resulting magic number
  magu.s = p - d.getBitWidth();  // resulting shift
  return magu;
}